

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::Y_formatter<spdlog::details::scoped_padder>::format
          (Y_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  uint value;
  scoped_padder p;
  scoped_padder sStack_58;
  char local_30 [21];
  char local_1b [3];
  char *local_18;
  
  scoped_padder::scoped_padder(&sStack_58,4,&(this->super_flag_formatter).padinfo_,dest);
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  value = -uVar1;
  if (0 < (int)uVar1) {
    value = uVar1;
  }
  local_18 = fmt::v11::detail::do_format_decimal<char,unsigned_int>(local_30,value,0x15);
  if (iVar2 < -0x76c) {
    local_18[-1] = '-';
    local_18 = local_18 + -1;
  }
  fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_18,local_1b);
  scoped_padder::~scoped_padder(&sStack_58);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 4;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }